

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall
FxRuntimeStateIndex::Resolve(FxRuntimeStateIndex *this,FCompileContext *ctx)

{
  bool bVar1;
  BYTE BVar2;
  int iVar3;
  PString *pPVar4;
  int iVar5;
  undefined4 extraout_var;
  FxIntCast *this_00;
  PClassActor *pPVar6;
  long *plVar7;
  FxExpression *pFVar8;
  FxConstant *this_01;
  char *message;
  FScriptPosition *other;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar8 = this->Index;
  if (pFVar8 != (FxExpression *)0x0) {
    iVar5 = (*pFVar8->_vptr_FxExpression[2])(pFVar8,ctx);
    this->Index = (FxExpression *)CONCAT44(extraout_var,iVar5);
  }
  if (this->Index != (FxExpression *)0x0) {
    iVar5 = (*(this->Index->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
    if ((char)iVar5 == '\0') {
      message = "Numeric type expected";
    }
    else {
      iVar5 = (*this->Index->_vptr_FxExpression[3])();
      if ((char)iVar5 == '\0') {
        if (this->Index->ValueType->RegType != '\0') {
          this_00 = (FxIntCast *)FMemArena::Alloc(&FxAlloc,0x38);
          pFVar8 = this->Index;
          bVar1 = ctx->FromDecorate;
          (this_00->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_00711370;
          FScriptPosition::FScriptPosition
                    (&(this_00->super_FxExpression).ScriptPosition,&pFVar8->ScriptPosition);
          (this_00->super_FxExpression).ValueType = (PType *)0x0;
          (this_00->super_FxExpression).isresolved = false;
          (this_00->super_FxExpression).NeedResult = true;
          (this_00->super_FxExpression).ExprType = EFX_IntCast;
          (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070f5b0;
          this_00->basex = pFVar8;
          (this_00->super_FxExpression).ValueType = (PType *)TypeSInt32;
          this_00->NoWarn = bVar1;
          this_00->Explicit = false;
          this->Index = (FxExpression *)this_00;
          pFVar8 = FxIntCast::Resolve(this_00,ctx);
          this->Index = pFVar8;
          if (pFVar8 == (FxExpression *)0x0) goto LAB_0053c8c1;
        }
        pPVar6 = dyn_cast<PClassActor>((DObject *)ctx->Class);
        if ((pPVar6 != (PClassActor *)0x0) && (0 < pPVar6->NumOwnedStates)) {
          iVar5 = FStateLabelStorage::AddPointer(&StateLabels,pPVar6->OwnedStates + ctx->StateIndex)
          ;
          this->symlabel = iVar5;
          (this->super_FxExpression).ValueType = (PType *)TypeStateLabel;
          return &this->super_FxExpression;
        }
        __assert_fail("aclass != nullptr && aclass->NumOwnedStates > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                      ,0x2640,
                      "virtual FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &)");
      }
      pPVar4 = (PString *)this->Index[1]._vptr_FxExpression;
      other = &this->Index[1].ScriptPosition;
      if (pPVar4 == TypeString) {
        FString::AttachToOther(&local_30,&other->FileName);
      }
      else {
        local_30.Chars = (other->FileName).Chars;
      }
      BVar2 = (pPVar4->super_PBasicType).super_PType.RegType;
      if (BVar2 == '\x01') {
        iVar5 = (int)(double)local_30.Chars;
      }
      else {
        iVar5 = 0;
        if (BVar2 == '\0') {
          iVar5 = (int)local_30.Chars;
        }
      }
      if (pPVar4 == TypeString) {
        FString::~FString(&local_30);
      }
      if (-1 < iVar5) {
        if (iVar5 != 0) {
          plVar7 = (long *)FMemArena::Alloc(&FxAlloc,0x30);
          iVar3 = ctx->StateIndex;
          *plVar7 = (long)&PTR__FxExpression_00711370;
          FScriptPosition::FScriptPosition
                    ((FScriptPosition *)(plVar7 + 1),&(this->super_FxExpression).ScriptPosition);
          plVar7[3] = 0;
          *(undefined2 *)(plVar7 + 4) = 0x100;
          *(undefined4 *)((long)plVar7 + 0x24) = 0x36;
          *plVar7 = (long)&PTR__FxExpression_00711688;
          *(int *)(plVar7 + 5) = iVar5 + iVar3;
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          pFVar8 = (FxExpression *)(**(code **)(*plVar7 + 0x10))(plVar7,ctx);
          return pFVar8;
        }
        if (ctx->FromDecorate != false) {
          this_01 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
          FxConstant::FxConstant(this_01,0,&(this->super_FxExpression).ScriptPosition);
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          (this_01->super_FxExpression).ValueType = (PType *)TypeStateLabel;
          return &this_01->super_FxExpression;
        }
      }
      message = "State index must be positive";
    }
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message);
  }
LAB_0053c8c1:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxRuntimeStateIndex::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Index, ctx);

	if (!Index->IsNumeric())
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return nullptr;
	}
	else if (Index->isConstant())
	{
		int index = static_cast<FxConstant *>(Index)->GetValue().GetInt();
		if (index < 0 || (index == 0 && !ctx.FromDecorate))
		{
			ScriptPosition.Message(MSG_ERROR, "State index must be positive");
			delete this;
			return nullptr;
		}
		else if (index == 0)
		{
			int symlabel = StateLabels.AddPointer(nullptr);
			auto x = new FxConstant(symlabel, ScriptPosition);
			delete this;
			x->ValueType = TypeStateLabel;
			return x;
		}
		else
		{
			auto x = new FxStateByIndex(ctx.StateIndex + index, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}
	else if (Index->ValueType->GetRegType() != REGT_INT)
	{ // Float.
		Index = new FxIntCast(Index, ctx.FromDecorate);
		SAFE_RESOLVE(Index, ctx);
	}
	auto aclass = dyn_cast<PClassActor>(ctx.Class);
	assert(aclass != nullptr && aclass->NumOwnedStates > 0);
	symlabel = StateLabels.AddPointer(aclass->OwnedStates + ctx.StateIndex);
	ValueType = TypeStateLabel;
	return this;
}